

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitDefinedFunction(PrintSExpression *this,Function *curr)

{
  uint uVar1;
  pointer ppSVar2;
  StackInst *pSVar3;
  Function *pFVar4;
  Index IVar5;
  size_t sVar6;
  ostream *poVar7;
  Type type;
  uint *puVar8;
  Name *this_00;
  Try *pTVar9;
  Block *pBVar10;
  Expression **ppEVar11;
  uint uVar12;
  ulong uVar13;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  PrintExpressionContents local_b8;
  StackIR *local_90;
  undefined1 auStack_88 [8];
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  anon_class_16_2_d966b294 doIndent;
  size_t indent;
  int local_34;
  
  ::doIndent(this->o,this->indent);
  this->currFunction = curr;
  if ((this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  }
  this->lastPrintIndent = 0;
  if ((curr->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    catchIndexStack.fixed._M_elems[0] =
         *(uint *)((long)&(curr->prologLocation).
                          super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload
                          .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                          _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> +
                  4);
    auStack_88 = *(undefined1 (*) [8])
                  &(curr->prologLocation).
                   super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
    catchIndexStack.usedFixed =
         *(size_t *)
          ((long)&(curr->prologLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8);
    catchIndexStack.fixed._M_elems[1]._0_1_ = 1;
    printDebugLocation(this,(optional<wasm::Function::DebugLocation> *)auStack_88);
  }
  handleSignature(this,curr,true);
  incIndent(this);
  IVar5 = Function::getVarIndexBase(curr);
  for (uVar13 = (ulong)IVar5; sVar6 = Function::getNumLocals(curr), uVar13 < sVar6;
      uVar13 = uVar13 + 1) {
    ::doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    str._M_str = "local ";
    str._M_len = 6;
    printMinor(this->o,str);
    poVar7 = anon_unknown_0::printLocal((Index)uVar13,this->currFunction,this->o);
    std::operator<<(poVar7,' ');
    type = Function::getLocalType(curr,(Index)uVar13);
    poVar7 = printType(this,type);
    std::operator<<(poVar7,')');
    std::operator<<(this->o,this->maybeNewLine);
  }
  if (((this->moduleStackIR).super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
       super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
       super__Optional_payload_base<wasm::ModuleStackIR>._M_engaged == false) ||
     (local_90 = ModuleStackIR::getStackIROrNull((ModuleStackIR *)&this->moduleStackIR,curr),
     local_90 == (StackIR *)0x0)) {
    if (((this->full == false) && (curr->body->_id == BlockId)) &&
       (pBVar10 = Expression::cast<wasm::Block>(curr->body),
       (pBVar10->name).super_IString.str._M_str == (char *)0x0)) {
      pBVar10 = Expression::cast<wasm::Block>(curr->body);
      catchIndexStack.usedFixed = 0;
      sVar6 = (pBVar10->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      auStack_88 = (undefined1  [8])&pBVar10->list;
      while ((catchIndexStack.usedFixed != sVar6 || (auStack_88 != (undefined1  [8])&pBVar10->list))
            ) {
        ppEVar11 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)auStack_88);
        printFullLine(this,*ppEVar11);
        catchIndexStack.usedFixed = catchIndexStack.usedFixed + 1;
      }
    }
    else {
      printFullLine(this,curr->body);
    }
    if (this->controlFlowDepth != 0) {
      __assert_fail("controlFlowDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                    ,0xc82,"void wasm::PrintSExpression::visitDefinedFunction(Function *)");
    }
  }
  else {
    poVar7 = this->o;
    doIndent.indent = (size_t *)(ulong)((uint)(this->currFunction != (Function *)0x0) * 2);
    doIndent.o = (ostream *)&doIndent.indent;
    auStack_88 = (undefined1  [8])0x0;
    catchIndexStack.fixed._M_elems[2] = 0;
    catchIndexStack.fixed._M_elems[3] = 0;
    catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar12 = 0;
    local_34 = 0;
    catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)poVar7;
    while( true ) {
      ppSVar2 = (local_90->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_90->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <=
          (ulong)uVar12) break;
      pSVar3 = ppSVar2[uVar12];
      if (pSVar3 == (StackInst *)0x0) goto LAB_00b1ae38;
      switch(pSVar3->op) {
      case Basic:
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (pSVar3->origin->_id != PopId) {
          PrintExpressionContents::PrintExpressionContents(&local_b8,this);
          Visitor<wasm::PrintExpressionContents,_void>::visit
                    ((Visitor<wasm::PrintExpressionContents,_void> *)&local_b8,pSVar3->origin);
        }
        goto LAB_00b1ae2c;
      case IfElse:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        str_03._M_str = "else";
        str_03._M_len = 4;
        printMedium(poVar7,str_03);
        break;
      case TryBegin:
        local_b8.parent._0_4_ = 0;
        SmallVector<unsigned_int,_4UL>::push_back
                  ((SmallVector<unsigned_int,_4UL> *)auStack_88,(uint *)&local_b8);
      case BlockBegin:
      case IfBegin:
      case LoopBegin:
      case TryTableBegin:
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        PrintExpressionContents::PrintExpressionContents(&local_b8,this);
        Visitor<wasm::PrintExpressionContents,_void>::visit
                  ((Visitor<wasm::PrintExpressionContents,_void> *)&local_b8,pSVar3->origin);
        local_34 = local_34 + 1;
        break;
      case Catch:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        str_01._M_str = "catch ";
        str_01._M_len = 6;
        printMedium(poVar7,str_01);
        pTVar9 = Expression::cast<wasm::Try>(pSVar3->origin);
        puVar8 = SmallVector<unsigned_int,_4UL>::back((SmallVector<unsigned_int,_4UL> *)auStack_88);
        uVar1 = *puVar8;
        *puVar8 = uVar1 + 1;
        this_00 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar9->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar1);
        Name::print(this_00,poVar7);
        break;
      case CatchAll:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        str_02._M_str = "catch_all";
        str_02._M_len = 9;
        printMedium(poVar7,str_02);
        break;
      case Delegate:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        str_04._M_str = "delegate ";
        str_04._M_len = 9;
        printMedium(poVar7,str_04);
        local_34 = local_34 + -1;
        pTVar9 = Expression::cast<wasm::Try>(pSVar3->origin);
        if ((pTVar9->delegateTarget).super_IString.str._M_str == DAT_011763a8) {
          std::ostream::operator<<(poVar7,local_34);
        }
        else {
          Name::print(&pTVar9->delegateTarget,poVar7);
        }
        goto LAB_00b1ae2c;
      case TryEnd:
        SmallVector<unsigned_int,_4UL>::pop_back((SmallVector<unsigned_int,_4UL> *)auStack_88);
      case BlockEnd:
      case IfEnd:
      case LoopEnd:
      case TryTableEnd:
        doIndent.indent = (size_t *)((long)doIndent.indent + -1);
        printStackIR::anon_class_16_2_d966b294::operator()
                  ((anon_class_16_2_d966b294 *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        str_00._M_str = "end";
        str_00._M_len = 3;
        printMedium(poVar7,str_00);
        local_34 = local_34 + -1;
        goto LAB_00b1ae2c;
      default:
        handle_unreachable("unexpeted op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                           ,0xecf);
      }
      doIndent.indent = (size_t *)((long)doIndent.indent + 1);
LAB_00b1ae2c:
      std::operator<<(poVar7,'\n');
LAB_00b1ae38:
      uVar12 = uVar12 + 1;
    }
    if (local_34 != 0) {
      __assert_fail("controlFlowDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                    ,0xed3,"std::ostream &wasm::printStackIR(StackIR *, PrintSExpression &)");
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               (catchIndexStack.fixed._M_elems + 2));
  }
  if ((this->currFunction->epilogLocation).
      super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    ::doIndent(this->o,this->indent);
    if (this->minify == false) {
      this->indent = this->indent - 1;
    }
    pFVar4 = this->currFunction;
    catchIndexStack.fixed._M_elems[0] =
         *(uint *)((long)&(pFVar4->epilogLocation).
                          super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload
                          .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                          _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> +
                  4);
    auStack_88 = *(undefined1 (*) [8])
                  &(pFVar4->epilogLocation).
                   super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
    catchIndexStack.usedFixed =
         *(size_t *)
          ((long)&(pFVar4->epilogLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8);
    catchIndexStack.fixed._M_elems[1]._0_1_ = 1;
    printDebugLocation(this,(optional<wasm::Function::DebugLocation> *)auStack_88);
    std::operator<<(this->o,')');
  }
  else {
    decIndent(this);
  }
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitDefinedFunction(Function* curr) {
  doIndent(o, indent);
  currFunction = curr;
  lastPrintedLocation = std::nullopt;
  lastPrintIndent = 0;
  if (currFunction->prologLocation) {
    printDebugLocation(*currFunction->prologLocation);
  }
  handleSignature(curr, true);
  incIndent();
  for (size_t i = curr->getVarIndexBase(); i < curr->getNumLocals(); i++) {
    doIndent(o, indent);
    o << '(';
    printMinor(o, "local ");
    printLocal(i, currFunction, o) << ' ';
    printType(curr->getLocalType(i)) << ')';
    o << maybeNewLine;
  }
  // Print the body.
  StackIR* stackIR = nullptr;
  if (moduleStackIR) {
    stackIR = moduleStackIR->getStackIROrNull(curr);
  }
  if (stackIR) {
    printStackIR(stackIR, *this);
  } else {
    // It is ok to emit a block here, as a function can directly contain a
    // list, even if our ast avoids that for simplicity. We can just do that
    // optimization here..
    if (!full && curr->body->is<Block>() &&
        curr->body->cast<Block>()->name.isNull()) {
      Block* block = curr->body->cast<Block>();
      for (auto item : block->list) {
        printFullLine(item);
      }
    } else {
      printFullLine(curr->body);
    }
    assert(controlFlowDepth == 0);
  }
  if (currFunction->epilogLocation) {
    // Print last debug location: mix of decIndent and printDebugLocation
    // logic.
    doIndent(o, indent);
    if (!minify) {
      indent--;
    }
    printDebugLocation(*currFunction->epilogLocation);
    o << ')';
  } else {
    decIndent();
  }
  o << maybeNewLine;
}